

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

int str_find_aux(lua_State *L,int find)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer pos;
  ptrdiff_t pVar4;
  char *pcVar5;
  bool bVar6;
  char *res;
  char *s1;
  undefined1 auStack_270 [4];
  int anchor;
  MatchState ms;
  char *s2;
  ptrdiff_t init;
  char *p;
  char *s;
  size_t l2;
  size_t l1;
  lua_State *plStack_18;
  int find_local;
  lua_State *L_local;
  
  l1._4_4_ = find;
  plStack_18 = L;
  pcVar3 = luaL_checklstring(L,1,&l2);
  init = (ptrdiff_t)luaL_checklstring(plStack_18,2,(size_t *)&s);
  pos = luaL_optinteger(plStack_18,3,1);
  pVar4 = posrelat(pos,l2);
  s2 = (char *)(pVar4 - 1);
  if ((long)s2 < 0) {
    s2 = (char *)0x0;
  }
  else if (l2 < s2) {
    s2 = (char *)l2;
  }
  if ((l1._4_4_ == 0) ||
     ((iVar2 = lua_toboolean(plStack_18,4), iVar2 == 0 &&
      (pcVar5 = strpbrk((char *)init,"^$*+?.([%-"), pcVar5 != (char *)0x0)))) {
    cVar1 = *(char *)init;
    if (cVar1 == '^') {
      init = init + 1;
    }
    ms.src_end = (char *)plStack_18;
    ms.src_init = pcVar3 + l2;
    res = pcVar3 + (long)s2;
    _auStack_270 = pcVar3;
    do {
      ms.L._0_4_ = 0;
      pcVar5 = match((MatchState *)auStack_270,res,(char *)init);
      if (pcVar5 != (char *)0x0) {
        if (l1._4_4_ != 0) {
          lua_pushinteger(plStack_18,(lua_Integer)(res + (1 - (long)pcVar3)));
          lua_pushinteger(plStack_18,(long)pcVar5 - (long)pcVar3);
          iVar2 = push_captures((MatchState *)auStack_270,(char *)0x0,(char *)0x0);
          return iVar2 + 2;
        }
        iVar2 = push_captures((MatchState *)auStack_270,res,pcVar5);
        return iVar2;
      }
      bVar6 = res < ms.src_init;
      res = res + 1;
    } while (bVar6 && cVar1 != '^');
  }
  else {
    ms.capture[0x1f].len =
         (ptrdiff_t)lmemfind(pcVar3 + (long)s2,l2 - (long)s2,(char *)init,(size_t)s);
    if ((char *)ms.capture[0x1f].len != (char *)0x0) {
      lua_pushinteger(plStack_18,(lua_Integer)(ms.capture[0x1f].len + (1 - (long)pcVar3)));
      lua_pushinteger(plStack_18,(lua_Integer)(s + (ms.capture[0x1f].len - (long)pcVar3)));
      return 2;
    }
    ms.capture[0x1f].len = 0;
  }
  lua_pushnil(plStack_18);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t l1, l2;
  const char *s = luaL_checklstring(L, 1, &l1);
  const char *p = luaL_checklstring(L, 2, &l2);
  ptrdiff_t init = posrelat(luaL_optinteger(L, 3, 1), l1) - 1;
  if (init < 0) init = 0;
  else if ((size_t)(init) > l1) init = (ptrdiff_t)l1;
  if (find && (lua_toboolean(L, 4) ||  /* explicit request? */
      strpbrk(p, SPECIALS) == NULL)) {  /* or no special characters? */
    /* do a plain search */
    const char *s2 = lmemfind(s+init, l1-init, p, l2);
    if (s2) {
      lua_pushinteger(L, s2-s+1);
      lua_pushinteger(L, s2-s+l2);
      return 2;
    }
  }
  else {
    MatchState ms;
    int anchor = (*p == '^') ? (p++, 1) : 0;
    const char *s1=s+init;
    ms.L = L;
    ms.src_init = s;
    ms.src_end = s+l1;
    do {
      const char *res;
      ms.level = 0;
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, s1-s+1);  /* start */
          lua_pushinteger(L, res-s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}